

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O2

vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> * __thiscall
mjs::regexp::impl::exec
          (vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> *__return_storage_ptr__,
          impl *this,wstring_view str)

{
  bool bVar1;
  wcmatch *__range2;
  pointer psVar2;
  sub_match<const_wchar_t_*> *m;
  pointer psVar3;
  wcmatch match;
  match_results<const_wchar_t_*,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  local_58;
  regexp_match local_38;
  
  local_58.
  super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_begin = (wchar_t *)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = std::__detail::
          __regex_algo_impl<wchar_t_const*,std::allocator<std::__cxx11::sub_match<wchar_t_const*>>,wchar_t,std::__cxx11::regex_traits<wchar_t>,(std::__detail::_RegexExecutorPolicy)0,false>
                    (str._M_str,str._M_str + str._M_len,&local_58,&this->r_,0);
  (__return_storage_ptr__->super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (bVar1) {
    psVar2 = local_58.
             super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -3;
    if (local_58.
        super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_58.
        super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar2 = local_58.
               super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (psVar3 = local_58.
                  super_vector<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar2; psVar3 = psVar3 + 1)
    {
      local_38.first = (psVar3->super_pair<const_wchar_t_*,_const_wchar_t_*>).first;
      local_38.second = (psVar3->super_pair<const_wchar_t_*,_const_wchar_t_*>).second;
      std::vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>::
      emplace_back<mjs::regexp_match>(__return_storage_ptr__,&local_38);
    }
  }
  std::
  _Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_wchar_t_*>,_std::allocator<std::__cxx11::sub_match<const_wchar_t_*>_>_>
                   *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<regexp_match> exec(const std::wstring_view str) const {
        std::wcmatch match;
        if (!std::regex_search(str.data(), str.data()+str.length(), match, r_)) {
            return {};
        }
        std::vector<regexp_match> res;
        for (const auto& m: match) {
            res.push_back(regexp_match{m.first, m.second});
        }
        return res;
    }